

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Vec_IntPushMem(Mem_Step_t *pMemMan,Vec_Int_t *p,int Entry)

{
  int *pEntry;
  int *piVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = p->nSize;
  if (iVar3 == p->nCap) {
    if (iVar3 == 0) {
      p->nCap = 1;
      iVar3 = 1;
    }
    if (pMemMan == (Mem_Step_t *)0x0) {
      piVar1 = (int *)malloc((long)(iVar3 * 2) << 2);
    }
    else {
      piVar1 = (int *)Mem_StepEntryFetch(pMemMan,iVar3 << 3);
    }
    pEntry = p->pArray;
    if (pEntry != (int *)0x0) {
      for (lVar2 = 0; lVar2 < p->nSize; lVar2 = lVar2 + 1) {
        piVar1[lVar2] = pEntry[lVar2];
      }
      if (pMemMan == (Mem_Step_t *)0x0) {
        free(pEntry);
      }
      else {
        Mem_StepEntryRecycle(pMemMan,(char *)pEntry,p->nCap << 2);
      }
    }
    p->nCap = p->nCap << 1;
    p->pArray = piVar1;
    iVar3 = p->nSize;
  }
  else {
    piVar1 = p->pArray;
  }
  p->nSize = iVar3 + 1;
  piVar1[iVar3] = Entry;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline void Vec_IntPushMem( Mem_Step_t * pMemMan, Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        int * pArray;
        int i;

        if ( p->nSize == 0 )
            p->nCap = 1;
        if ( pMemMan )
            pArray = (int *)Mem_StepEntryFetch( pMemMan, p->nCap * 8 );
        else
            pArray = ABC_ALLOC( int, p->nCap * 2 );
        if ( p->pArray )
        {
            for ( i = 0; i < p->nSize; i++ )
                pArray[i] = p->pArray[i];
            if ( pMemMan )
                Mem_StepEntryRecycle( pMemMan, (char *)p->pArray, p->nCap * 4 );
            else
                ABC_FREE( p->pArray );
        }
        p->nCap *= 2;
        p->pArray = pArray;
    }
    p->pArray[p->nSize++] = Entry;
}